

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

hash_iter_t * hash_table_iter_next(hash_iter_t *itor)

{
  hash_entry_s *phVar1;
  hash_table_t *phVar2;
  ulong uVar3;
  ulong uVar4;
  hash_entry_t *phVar5;
  
  if ((itor->ent == (hash_entry_t *)0x0) ||
     (phVar1 = itor->ent->next, itor->ent = phVar1, phVar1 == (hash_entry_s *)0x0)) {
    phVar2 = itor->ht;
    uVar3 = itor->idx;
    uVar4 = (ulong)phVar2->size;
    if (uVar3 < uVar4) {
      phVar5 = phVar2->table + uVar3;
      do {
        if (phVar5->key != (char *)0x0) goto LAB_0010725f;
        uVar3 = uVar3 + 1;
        itor->idx = uVar3;
        phVar5 = phVar5 + 1;
      } while (uVar4 != uVar3);
    }
    else {
LAB_0010725f:
      if (uVar3 != uVar4) {
        itor->ent = phVar2->table + uVar3;
        itor->idx = uVar3 + 1;
        return itor;
      }
    }
    ckd_free(itor);
    itor = (hash_iter_t *)0x0;
  }
  return itor;
}

Assistant:

hash_iter_t *
hash_table_iter_next(hash_iter_t *itor)
{
	/* If there is an entry, walk down its list. */
	if (itor->ent)
		itor->ent = itor->ent->next;
	/* If we got to the end of the chain, or we had no entry, scan
	 * forward in the table to find the next non-empty bucket. */
	if (itor->ent == NULL) {
		while (itor->idx < itor->ht->size
		       && itor->ht->table[itor->idx].key == NULL) 
			++itor->idx;
		/* If we did not find one then delete the iterator and
		 * return NULL. */
		if (itor->idx == itor->ht->size) {
			hash_table_iter_free(itor);
			return NULL;
		}
		/* Otherwise use this next entry. */
		itor->ent = itor->ht->table + itor->idx;
		/* Increase idx for the next time around. */
		++itor->idx;
	}
	return itor;
}